

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseAssertTrapCommand(WastParser *this,CommandPtr *out_command)

{
  Command *pCVar1;
  bool bVar2;
  Result RVar3;
  Command *in_RAX;
  Command *local_28;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  RVar3 = Expect(this,AssertTrap);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  bVar2 = PeekMatchLpar(this,Module);
  if (bVar2) {
    std::make_unique<wabt::AssertModuleCommand<(wabt::CommandType)7>>();
    RVar3 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                    *)(in_RAX + 1));
  }
  else {
    std::make_unique<wabt::AssertTrapCommandBase<(wabt::CommandType)9>>();
    RVar3 = ParseAction(this,(ActionPtr *)(in_RAX + 1));
  }
  if ((RVar3.enum_ == Error) ||
     (RVar3 = ParseQuotedText(this,(string *)&in_RAX[1].type,true), RVar3.enum_ == Error)) {
    bVar2 = false;
    local_28 = in_RAX;
  }
  else {
    local_28 = (Command *)0x0;
    pCVar1 = (out_command->_M_t).
             super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
             super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
    (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = in_RAX;
    if (pCVar1 == (Command *)0x0) goto LAB_0013e4ee;
    (*pCVar1->_vptr_Command[1])();
    bVar2 = true;
  }
  if (local_28 != (Command *)0x0) {
    (*local_28->_vptr_Command[1])();
  }
  if (!bVar2) {
    return (Result)Error;
  }
LAB_0013e4ee:
  RVar3 = Expect(this,Rpar);
  return (Result)(uint)(RVar3.enum_ == Error);
}

Assistant:

Result WastParser::ParseAssertTrapCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseAssertTrapCommand);
  EXPECT(Lpar);
  EXPECT(AssertTrap);
  if (PeekMatchLpar(TokenType::Module)) {
    auto command = std::make_unique<AssertUninstantiableCommand>();
    CHECK_RESULT(ParseScriptModule(&command->module));
    CHECK_RESULT(ParseQuotedText(&command->text));
    *out_command = std::move(command);
  } else {
    auto command = std::make_unique<AssertTrapCommand>();
    CHECK_RESULT(ParseAction(&command->action));
    CHECK_RESULT(ParseQuotedText(&command->text));
    *out_command = std::move(command);
  }
  EXPECT(Rpar);
  return Result::Ok;
}